

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Gia_Man_t * Gia_ManDupWithMuxPos(Gia_Man_t *p)

{
  byte *pbVar1;
  uint uVar2;
  uint Entry;
  uint Entry_00;
  uint Entry_01;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Int_t *p_01;
  void *__ptr;
  void *__s;
  Gia_Man_t *p_02;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  uint *puVar10;
  int iVar11;
  Vec_Int_t *pVVar12;
  size_t sVar13;
  ulong uVar14;
  uint uVar15;
  size_t sVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  Gia_Obj_t *pGVar22;
  Gia_Obj_t *pGVar23;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_50;
  Gia_Obj_t *local_48;
  long local_40;
  Gia_Man_t *local_38;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_00->pArray = piVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_01->pArray = piVar6;
  iVar11 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  if (iVar11 == 0) {
    __ptr = (void *)0x0;
    sVar16 = 0;
    __s = (void *)0x0;
  }
  else {
    sVar16 = (long)iVar11 << 2;
    __ptr = calloc(1,sVar16);
    __s = malloc(sVar16);
  }
  memset(__s,0,sVar16);
  local_38 = p;
  p_02 = Gia_ManDup(p);
  if (p_02->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pNew) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x8d2,"Gia_Man_t *Gia_ManDupWithMuxPos(Gia_Man_t *)");
  }
  uVar21 = iVar11 * 0x20;
  uVar8 = (ulong)(uint)p_02->nObjs;
  if (0 < p_02->nObjs) {
    lVar19 = 0;
    lVar17 = 0;
    do {
      pGVar9 = p_02->pObjs;
      if (pGVar9 == (Gia_Obj_t *)0x0) break;
      pGVar5 = (Gia_Obj_t *)(&pGVar9->field_0x0 + lVar19);
      if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
        iVar11 = Gia_ObjIsMuxType(pGVar5);
        if (iVar11 == 0) {
          uVar8 = (ulong)(uint)p_02->nObjs;
        }
        else {
          local_40 = lVar17;
          pGVar7 = Gia_ObjRecognizeMux(pGVar5,&local_50,&local_48);
          pGVar23 = (Gia_Obj_t *)((ulong)local_48 & 0xfffffffffffffffe);
          pGVar22 = (Gia_Obj_t *)((ulong)local_50 & 0xfffffffffffffffe);
          pGVar4 = p_02->pObjs;
          local_50 = pGVar22;
          local_48 = pGVar23;
          if ((((pGVar5 < pGVar4) || (pGVar4 + p_02->nObjs <= pGVar5)) ||
              (pGVar7 = (Gia_Obj_t *)((ulong)pGVar7 & 0xfffffffffffffffe), pGVar7 < pGVar4)) ||
             (pGVar4 + p_02->nObjs <= pGVar7)) goto LAB_00246b8c;
          Vec_IntPush(p_01,(int)((ulong)((long)pGVar9 + (lVar19 - (long)pGVar4)) >> 2) * -0x55555555
                     );
          Vec_IntPush(p_01,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_02->pObjs;
          if (((pGVar23 < pGVar4) || (pGVar4 + p_02->nObjs <= pGVar23)) ||
             ((pGVar22 < pGVar4 || (pGVar4 + p_02->nObjs <= pGVar22)))) goto LAB_00246b8c;
          Vec_IntPush(p_01,(int)((ulong)((long)pGVar23 - (long)pGVar4) >> 2) * -0x55555555);
          Vec_IntPush(p_01,(int)((ulong)((long)pGVar22 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_02->pObjs;
          if (pGVar5 < pGVar4) goto LAB_00246b8c;
          uVar8 = (ulong)p_02->nObjs;
          pGVar7 = pGVar4 + uVar8;
          if (pGVar7 <= pGVar5) goto LAB_00246b8c;
          lVar17 = ((long)pGVar9 + (lVar19 - (long)pGVar4) >> 2) * -0x5555555555555555;
          uVar15 = (uint)lVar17;
          if (((int)uVar15 < 0) || ((int)uVar21 <= (int)uVar15)) {
LAB_00246c9a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          puVar10 = (uint *)((long)__ptr + (ulong)(uVar15 >> 3 & 0xffffffc));
          *puVar10 = *puVar10 | 1 << ((byte)lVar17 & 0x1f);
          if ((pGVar23 < pGVar4) || (pGVar7 <= pGVar23)) goto LAB_00246b8c;
          lVar17 = ((long)pGVar23 - (long)pGVar4 >> 2) * -0x5555555555555555;
          uVar15 = (uint)lVar17;
          if (((int)uVar15 < 0) || (uVar21 <= uVar15)) goto LAB_00246c9a;
          puVar10 = (uint *)((long)__s + (ulong)(uVar15 >> 3 & 0xffffffc));
          *puVar10 = *puVar10 | 1 << ((byte)lVar17 & 0x1f);
          if ((pGVar22 < pGVar4) || (pGVar7 <= pGVar22)) goto LAB_00246b8c;
          lVar17 = ((long)pGVar22 - (long)pGVar4 >> 2) * -0x5555555555555555;
          uVar15 = (uint)lVar17;
          if (((int)uVar15 < 0) || (uVar21 <= uVar15)) goto LAB_00246c9a;
          puVar10 = (uint *)((long)__s + (ulong)(uVar15 >> 3 & 0xffffffc));
          *puVar10 = *puVar10 | 1 << ((byte)lVar17 & 0x1f);
          lVar17 = local_40;
        }
      }
      lVar17 = lVar17 + 1;
      lVar19 = lVar19 + 0xc;
    } while (lVar17 < (int)uVar8);
  }
  pVVar12 = p_02->vCos;
  if (0 < pVVar12->nSize) {
    lVar17 = 0;
    do {
      iVar11 = pVVar12->pArray[lVar17];
      if (((long)iVar11 < 0) || (p_02->nObjs <= iVar11)) goto LAB_00246bab;
      if (p_02->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar9 = p_02->pObjs + iVar11;
      *(ulong *)(pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff)) =
           *(ulong *)(pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff)) | 0x40000000;
      lVar17 = lVar17 + 1;
      pVVar12 = p_02->vCos;
    } while (lVar17 < pVVar12->nSize);
  }
  uVar15 = p_01->nSize;
  uVar8 = (ulong)(int)uVar15;
  if (3 < (long)uVar8) {
    uVar20 = 0;
    do {
      if ((((uVar8 <= uVar20) || (uVar8 <= uVar20 + 1)) || (uVar8 <= uVar20 + 2)) ||
         (uVar8 <= uVar20 + 3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar6 = p_01->pArray;
      uVar2 = piVar6[uVar20];
      if (((int)uVar2 < 0) || ((int)uVar21 <= (int)uVar2)) {
LAB_00246be9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      Entry = piVar6[uVar20 + 1];
      Entry_00 = piVar6[uVar20 + 2];
      Entry_01 = piVar6[uVar20 + 3];
      if (((*(uint *)((long)__ptr + (ulong)(uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) == 0) ||
         ((*(uint *)((long)__s + (ulong)(uVar2 >> 5) * 4) & 1 << ((byte)uVar2 & 0x1f)) == 0)) {
        if (((int)Entry_00 < 0) || ((int)uVar21 <= (int)Entry_00)) goto LAB_00246be9;
        if (((*(uint *)((long)__ptr + (ulong)(Entry_00 >> 5) * 4) >> (Entry_00 & 0x1f) & 1) != 0) &&
           ((*(uint *)((long)__s + (ulong)(Entry_00 >> 5) * 4) & 1 << ((byte)Entry_00 & 0x1f)) != 0)
           ) goto LAB_002466ff;
        if (((int)Entry_01 < 0) || (uVar21 <= Entry_01)) goto LAB_00246be9;
        if (((*(uint *)((long)__ptr + (ulong)(Entry_01 >> 5) * 4) >> (Entry_01 & 0x1f) & 1) != 0) &&
           ((*(uint *)((long)__s + (ulong)(Entry_01 >> 5) * 4) & 1 << ((byte)Entry_01 & 0x1f)) != 0)
           ) goto LAB_002466ff;
      }
      else {
LAB_002466ff:
        uVar3 = local_38->nObjs;
        if ((((int)uVar3 <= (int)uVar2) ||
            ((((int)Entry < 0 || (uVar3 <= Entry)) || ((int)Entry_00 < 0)))) ||
           (((uVar3 <= Entry_00 || ((int)Entry_01 < 0)) || (uVar3 <= Entry_01)))) goto LAB_00246bab;
        pGVar9 = local_38->pObjs;
        if ((*(ulong *)(pGVar9 + uVar2) & 0xc0000000) == 0 &&
            (~(uint)*(ulong *)(pGVar9 + uVar2) & 0x1fffffff) != 0) {
          Vec_IntPush(p_00,uVar2);
        }
        if ((*(ulong *)(pGVar9 + Entry) & 0xc0000000) == 0 &&
            (~(uint)*(ulong *)(pGVar9 + Entry) & 0x1fffffff) != 0) {
          Vec_IntPush(p_00,Entry);
        }
        if ((*(ulong *)(pGVar9 + Entry_00) & 0xc0000000) == 0 &&
            (~(uint)*(ulong *)(pGVar9 + Entry_00) & 0x1fffffff) != 0) {
          Vec_IntPush(p_00,Entry_00);
        }
        if ((*(ulong *)(pGVar9 + Entry_01) & 0xc0000000) == 0 &&
            (~(uint)*(ulong *)(pGVar9 + Entry_01) & 0x1fffffff) != 0) {
          Vec_IntPush(p_00,Entry_01);
        }
      }
      uVar20 = uVar20 + 4;
    } while ((uVar15 & 0xfffffffc) != uVar20);
  }
  if (0 < p_02->nObjs) {
    lVar17 = 0;
    lVar19 = 0;
    do {
      if (p_02->pObjs == (Gia_Obj_t *)0x0) break;
      pbVar1 = &p_02->pObjs->field_0x3 + lVar17;
      *pbVar1 = *pbVar1 & 0xbf;
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0xc;
    } while (lVar19 < p_02->nObjs);
  }
  uVar21 = p_00->nSize;
  sVar16 = (size_t)(int)uVar21;
  piVar6 = p_00->pArray;
  if (1 < (long)sVar16) {
    qsort(piVar6,sVar16,4,Vec_IntSortCompare1);
    uVar21 = 1;
    sVar13 = 1;
    do {
      if (piVar6[sVar13] != piVar6[sVar13 - 1]) {
        lVar17 = (long)(int)uVar21;
        uVar21 = uVar21 + 1;
        piVar6[lVar17] = piVar6[sVar13];
      }
      sVar13 = sVar13 + 1;
    } while (sVar16 != sVar13);
  }
  if ((int)uVar21 < 1) {
    if (piVar6 == (int *)0x0) goto LAB_00246b32;
  }
  else {
    uVar8 = 0;
    do {
      iVar11 = piVar6[uVar8];
      if ((long)iVar11 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar15 = p_02->nObjs;
      if ((int)uVar15 <= iVar11) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar9 = p_02->pObjs;
      if ((~*(uint *)(pGVar9 + iVar11) & 0x1fffffff) != 0 && (int)*(uint *)(pGVar9 + iVar11) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      if (uVar15 == p_02->nObjsAlloc) {
        uVar2 = uVar15 * 2;
        if (0x1fffffff < (int)(uVar15 * 2)) {
          uVar2 = 0x20000000;
        }
        if (uVar15 == 0x20000000) {
          puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
          exit(1);
        }
        if ((int)uVar2 <= (int)uVar15) {
          __assert_fail("p->nObjs < nObjNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x288,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
        }
        uVar20 = (ulong)uVar2;
        if (p_02->fVerbose == 0) {
LAB_00246984:
          pGVar9 = (Gia_Obj_t *)realloc(pGVar9,uVar20 * 0xc);
          iVar18 = p_02->nObjsAlloc;
        }
        else {
          printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar15,(ulong)uVar2);
          iVar18 = p_02->nObjsAlloc;
          if (iVar18 < 1) {
            __assert_fail("p->nObjsAlloc > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x28b,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
          }
          pGVar9 = p_02->pObjs;
          if (pGVar9 != (Gia_Obj_t *)0x0) goto LAB_00246984;
          pGVar9 = (Gia_Obj_t *)malloc(uVar20 * 0xc);
        }
        p_02->pObjs = pGVar9;
        memset(pGVar9 + iVar18,0,(long)(int)(uVar2 - iVar18) * 0xc);
        if (p_02->pMuxes != (uint *)0x0) {
          puVar10 = (uint *)realloc(p_02->pMuxes,uVar20 << 2);
          p_02->pMuxes = puVar10;
          memset(puVar10 + p_02->nObjsAlloc,0,(uVar20 - (long)p_02->nObjsAlloc) * 4);
        }
        p_02->nObjsAlloc = uVar2;
      }
      if ((p_02->vHTable).nSize != 0) {
        Vec_IntPush(&p_02->vHash,0);
      }
      iVar18 = p_02->nObjs;
      p_02->nObjs = iVar18 + 1;
      if ((long)iVar18 < 0) {
LAB_00246bab:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar9 = p_02->pObjs + iVar18;
      uVar20 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar20 | 0x80000000;
      pGVar5 = p_02->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_02->nObjs <= pGVar9)) {
LAB_00246b8c:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar14 = (ulong)(((uint)((int)pGVar9 - (int)pGVar5) >> 2) * -0x55555555 - iVar11 & 0x1fffffff)
      ;
      *(ulong *)pGVar9 = uVar20 & 0xffffffffc0000000 | 0x80000000 | uVar14;
      *(ulong *)pGVar9 =
           uVar20 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
           (ulong)(p_02->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_02->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_02->nObjs <= pGVar9)) goto LAB_00246b8c;
      Vec_IntPush(p_02->vCos,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
      if (p_02->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_02,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),pGVar9);
      }
      if ((pGVar9 < p_02->pObjs) || (p_02->pObjs + p_02->nObjs <= pGVar9)) goto LAB_00246b8c;
      uVar8 = uVar8 + 1;
    } while (uVar21 != uVar8);
  }
  free(piVar6);
LAB_00246b32:
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return p_02;
}

Assistant:

Gia_Man_t * Gia_ManDupWithMuxPos( Gia_Man_t * p )
{
    Vec_Int_t * vPoints = Vec_IntAlloc( 1000 );
    Vec_Int_t * vQuads  = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vHeads  = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vDatas  = Vec_BitStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1;
    Gia_Man_t * pNew = Gia_ManDup( p ); int i, iObj;
    assert( Gia_ManRegNum(pNew) == 0 );
    Gia_ManForEachAnd( pNew, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        pCtrl  = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        pCtrl  = Gia_Regular(pCtrl);
        pData0 = Gia_Regular(pData0);
        pData1 = Gia_Regular(pData1);
        Vec_IntPushTwo( vQuads, Gia_ObjId(pNew, pObj),   Gia_ObjId(pNew, pCtrl)  );
        Vec_IntPushTwo( vQuads, Gia_ObjId(pNew, pData0), Gia_ObjId(pNew, pData1) );
        Vec_BitWriteEntry( vHeads, Gia_ObjId(pNew, pObj),   1 );
        Vec_BitWriteEntry( vDatas, Gia_ObjId(pNew, pData0), 1 );
        Vec_BitWriteEntry( vDatas, Gia_ObjId(pNew, pData1), 1 );
    }
    Gia_ManForEachCo( pNew, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    for ( i = 0; i < Vec_IntSize(vQuads)/4; i++ )
    {
        int iObj   = Vec_IntEntry( vQuads, 4*i+0 );
        int iCtrl  = Vec_IntEntry( vQuads, 4*i+1 );
        int iData0 = Vec_IntEntry( vQuads, 4*i+2 );
        int iData1 = Vec_IntEntry( vQuads, 4*i+3 );
        if ( (Vec_BitEntry(vHeads, iObj)   && Vec_BitEntry(vDatas, iObj))   || 
             (Vec_BitEntry(vHeads, iData0) && Vec_BitEntry(vDatas, iData0)) || 
             (Vec_BitEntry(vHeads, iData1) && Vec_BitEntry(vDatas, iData1)) )
        {
            Gia_Obj_t * pObj   = Gia_ManObj( p, iObj );
            Gia_Obj_t * pCtrl  = Gia_ManObj( p, iCtrl );
            Gia_Obj_t * pData0 = Gia_ManObj( p, iData0 );
            Gia_Obj_t * pData1 = Gia_ManObj( p, iData1 );
            if ( Gia_ObjIsAnd(pObj)   && !pObj->fMark0   )  Vec_IntPush( vPoints, iObj   );
            if ( Gia_ObjIsAnd(pCtrl)  && !pCtrl->fMark0  )  Vec_IntPush( vPoints, iCtrl  );
            if ( Gia_ObjIsAnd(pData0) && !pData0->fMark0 )  Vec_IntPush( vPoints, iData0 );
            if ( Gia_ObjIsAnd(pData1) && !pData1->fMark0 )  Vec_IntPush( vPoints, iData1 );
        }
    }
    Gia_ManCleanMark0( pNew );
    Vec_IntUniqify( vPoints );
    Vec_IntForEachEntry( vPoints, iObj, i )
        Gia_ManAppendCo( pNew, Abc_Var2Lit(iObj, 0) );
    Vec_IntFree( vPoints );
    Vec_IntFree( vQuads );
    Vec_BitFree( vHeads );
    Vec_BitFree( vDatas );
    return pNew;
}